

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O2

void ffx_encrypt(ptls_cipher_context_t *_ctx,void *output,void *input,size_t len)

{
  uint8_t *tweaks;
  byte bVar1;
  _func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *__n;
  st_ptls_cipher_algorithm_t *psVar2;
  uint8_t nb_rounds;
  int i;
  int iVar3;
  char cVar4;
  undefined4 local_9c;
  uint8_t right [16];
  uint8_t left [16];
  uint8_t iv [16];
  uint8_t confusion [32];
  
  if (_ctx->do_transform != ffx_encrypt) {
    __assert_fail("ctx->super.do_transform == ffx_encrypt",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x90,"void ffx_encrypt(ptls_cipher_context_t *, void *, const void *, size_t)");
  }
  if (_ctx[1].do_init != (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)len) {
    __assert_fail("len == ctx->byte_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/ffx.c",
                  0x93,"void ffx_encrypt(ptls_cipher_context_t *, void *, const void *, size_t)");
  }
  __n = _ctx[1].do_transform;
  memcpy(left,input,(size_t)__n);
  psVar2 = _ctx[2].algo;
  memcpy(right,(_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
               ((long)input + (long)__n),(size_t)psVar2);
  iVar3 = 0;
  memset(left + (long)__n,0,0x10 - (long)__n);
  memset(right + (long)psVar2,0,0x10 - (long)psVar2);
  bVar1 = right[(long)((long)&psVar2[-1].setup_crypto + 7)];
  right[(long)((long)&psVar2[-1].setup_crypto + 7)] = *(byte *)&_ctx[2].do_dispose & bVar1;
  tweaks = (uint8_t *)((long)&_ctx[2].do_dispose + 1);
  if (*(int *)((long)&_ctx[1].do_dispose + 4) == 0) {
    cVar4 = -2;
    iVar3 = 0;
    while (iVar3 < *(int *)&_ctx[1].do_dispose) {
      nb_rounds = (uint8_t)*(int *)&_ctx[1].do_dispose;
      local_9c = iVar3;
      ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,left,(size_t)_ctx[1].do_transform,
                        right,(size_t)_ctx[2].algo,*(uint8_t *)&_ctx[2].do_dispose,confusion,iv,
                        tweaks,nb_rounds + cVar4 + '\x01',nb_rounds);
      ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,right,(size_t)_ctx[2].algo,left,
                        (size_t)_ctx[1].do_transform,0xff,confusion,iv,tweaks,
                        *(uint8_t *)&_ctx[1].do_dispose + cVar4,*(uint8_t *)&_ctx[1].do_dispose);
      cVar4 = cVar4 + -2;
      iVar3 = local_9c + 2;
    }
  }
  else {
    for (; iVar3 < *(int *)&_ctx[1].do_dispose; iVar3 = iVar3 + 2) {
      ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,right,(size_t)_ctx[2].algo,left,
                        (size_t)_ctx[1].do_transform,0xff,confusion,iv,tweaks,(uint8_t)iVar3,
                        (uint8_t)*(int *)&_ctx[1].do_dispose);
      ptls_ffx_one_pass((ptls_cipher_context_t *)_ctx[1].algo,left,(size_t)_ctx[1].do_transform,
                        right,(size_t)_ctx[2].algo,*(uint8_t *)&_ctx[2].do_dispose,confusion,iv,
                        tweaks,(uint8_t)iVar3 + '\x01',*(uint8_t *)&_ctx[1].do_dispose);
    }
  }
  memcpy(output,left,(size_t)_ctx[1].do_transform);
  psVar2 = _ctx[2].algo;
  right[(long)((long)&psVar2[-1].setup_crypto + 7)] =
       (right[(long)((long)&psVar2[-1].setup_crypto + 7)] ^ bVar1) & *(byte *)&_ctx[2].do_dispose ^
       bVar1;
  memcpy((_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
         ((long)output + (long)_ctx[1].do_transform),right,(size_t)psVar2);
  (*ptls_clear_memory)(left,0x10);
  (*ptls_clear_memory)(right,0x10);
  (*ptls_clear_memory)(confusion,0x20);
  return;
}

Assistant:

static void ffx_encrypt(ptls_cipher_context_t *_ctx, void *output, const void *input, size_t len)
{
    ptls_ffx_context_t *ctx = (ptls_ffx_context_t *)_ctx;
    uint8_t left[16], right[16], confusion[32], iv[16];
    uint8_t last_byte;

    assert(ctx->super.do_transform == ffx_encrypt);

    /* len must match context definition */
    assert(len == ctx->byte_length);
    if (len != ctx->byte_length) {
        memset(output, 0, len); /* so that we do not leak anything in production mode */
        return;
    }

    /* Split the input in two halves */
    memcpy(left, input, ctx->nb_left);
    memcpy(right, ((uint8_t *)input) + ctx->nb_left, ctx->nb_right);
    memset(left + ctx->nb_left, 0, 16 - ctx->nb_left);
    memset(right + ctx->nb_right, 0, 16 - ctx->nb_right);
    last_byte = right[ctx->nb_right - 1];
    right[ctx->nb_right - 1] &= ctx->mask_last_byte;

    if (ctx->is_enc) {
        /* Feistel construct, using the specified algorithm as S-Box */
        for (int i = 0; i < ctx->nb_rounds; i += 2) {
            /* Each pass encrypts a zero field with a cipher using one
             * half of the message as IV. This construct lets us use
             * either AES or chacha 20 */
            ptls_ffx_one_pass(ctx->enc_ctx, right, ctx->nb_right, left, ctx->nb_left, 0xFF, confusion, iv, ctx->tweaks, i,
                              ctx->nb_rounds);
            ptls_ffx_one_pass(ctx->enc_ctx, left, ctx->nb_left, right, ctx->nb_right, ctx->mask_last_byte, confusion, iv,
                              ctx->tweaks, i + 1, ctx->nb_rounds);
        }
    } else {
        /* Feistel construct, using the specified algorithm as S-Box,
         * in the opposite order of the encryption */

        for (int i = 0; i < ctx->nb_rounds; i += 2) {
            /* Each pass encrypts a zero field with a cipher using one
             * half of the message as IV. This construct lets us use
             * either AES or chacha 20 */

            ptls_ffx_one_pass(ctx->enc_ctx, left, ctx->nb_left, right, ctx->nb_right, ctx->mask_last_byte, confusion, iv,
                              ctx->tweaks, ctx->nb_rounds - 1 - i, ctx->nb_rounds);
            ptls_ffx_one_pass(ctx->enc_ctx, right, ctx->nb_right, left, ctx->nb_left, 0xFF, confusion, iv, ctx->tweaks,
                              ctx->nb_rounds - 2 - i, ctx->nb_rounds);
        }
    }
    /* After enough passes, we have a very strong length preserving
     * encryption, only that many times slower than the underlying
     * algorithm. We copy the result to the output */
    memcpy(output, left, ctx->nb_left);

    right[ctx->nb_right - 1] &= ctx->mask_last_byte;
    right[ctx->nb_right - 1] |= (last_byte & ~ctx->mask_last_byte);

    memcpy(((uint8_t *)output) + ctx->nb_left, right, ctx->nb_right);

    ptls_clear_memory(left, sizeof(left));
    ptls_clear_memory(right, sizeof(right));
    ptls_clear_memory(confusion, sizeof(confusion));
}